

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

bool ON_Intersect(ON_BoundingBox *bbox,ON_Line *line,double tol,ON_Interval *line_parameters)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int iVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool local_1c2;
  int local_198;
  bool local_192;
  undefined1 auStack_148 [4];
  int k;
  double dStack_140;
  double local_138;
  ON_3dPoint local_130;
  undefined4 local_118;
  int local_104;
  undefined1 auStack_100 [4];
  int j;
  double dStack_f8;
  double local_f0;
  ON_3dPoint local_e8;
  undefined1 local_d0 [8];
  ON_Line chord;
  undefined1 local_98 [4];
  int i;
  ON_3dVector v;
  double M;
  double t1;
  double t0;
  double s1;
  double s0;
  double mx;
  double mn;
  double d;
  double b;
  double a;
  ON_Interval *line_parameters_local;
  double tol_local;
  ON_Line *line_local;
  ON_BoundingBox *bbox_local;
  
  v.z = 1e+308;
  ON_Line::Direction((ON_3dVector *)local_98,line);
  chord.to.z._4_4_ = ON_3dVector::MaximumCoordinateIndex((ON_3dVector *)local_98);
  line_parameters_local = (ON_Interval *)tol;
  if (tol < 0.0) {
    line_parameters_local = (ON_Interval *)0x0;
  }
  dVar3 = ON_3dPoint::operator[](&line->from,chord.to.z._4_4_);
  dVar4 = ON_3dPoint::operator[](&line->to,chord.to.z._4_4_);
  dVar5 = ON_3dPoint::operator[](&bbox->m_min,chord.to.z._4_4_);
  dVar6 = ON_3dPoint::operator[](&bbox->m_max,chord.to.z._4_4_);
  if (dVar6 < dVar5) {
    return false;
  }
  dVar5 = dVar5 - ((double)line_parameters_local + dVar3);
  dVar6 = ((double)line_parameters_local - dVar3) + dVar6;
  if (dVar6 < dVar5) {
    return false;
  }
  dVar4 = dVar4 - dVar3;
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    if ((dVar5 <= 0.0) && (0.0 <= dVar6)) {
      return false;
    }
    if (line_parameters != (ON_Interval *)0x0) {
      ON_Interval::Set(line_parameters,0.0,0.0);
    }
    return true;
  }
  if ((ABS(dVar4) < 1.0) &&
     ((ABS(dVar4) * 1e+308 <= ABS(dVar5) || (ABS(dVar4) * 1e+308 <= ABS(dVar6))))) {
    return false;
  }
  t1 = dVar5 * (1.0 / dVar4);
  M = dVar6 * (1.0 / dVar4);
  ON_Line::PointAt(&local_e8,line,t1);
  ON_Line::PointAt((ON_3dPoint *)auStack_100,line,M);
  from_pt.y = local_e8.y;
  from_pt.x = local_e8.x;
  from_pt.z = local_e8.z;
  to_pt.y = dStack_f8;
  to_pt.x = _auStack_100;
  to_pt.z = local_f0;
  ON_Line::ON_Line((ON_Line *)local_d0,from_pt,to_pt);
  iVar1 = chord.to.z._4_4_;
  pdVar2 = ON_3dVector::operator[]
                     ((ON_3dVector *)local_98,
                      chord.to.z._4_4_ + 1 + ((chord.to.z._4_4_ + 1) / 3) * -3);
  dVar3 = *pdVar2;
  pdVar2 = ON_3dVector::operator[]
                     ((ON_3dVector *)local_98,
                      chord.to.z._4_4_ + 2 + ((chord.to.z._4_4_ + 2) / 3) * -3);
  local_104 = (int)((iVar1 - (uint)(ABS(*pdVar2) < ABS(dVar3))) + 2) % 3;
  pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)local_d0,local_104);
  dVar3 = *pdVar2;
  pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&chord.from.z,local_104);
  dVar5 = *pdVar2;
  dVar6 = ON_3dPoint::operator[](&bbox->m_min,local_104);
  dVar4 = ON_3dPoint::operator[](&bbox->m_max,local_104);
  if (dVar4 < dVar6) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  dVar6 = dVar6 - ((double)line_parameters_local + dVar3);
  dVar4 = ((double)line_parameters_local - dVar3) + dVar4;
  if (dVar4 < dVar6) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  dVar5 = dVar5 - dVar3;
  if (((0.0 < dVar6) && (dVar5 < dVar6)) || ((dVar4 < 0.0 && (dVar4 < dVar5)))) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  local_192 = true;
  if (ABS(dVar5) < 1.0) {
    local_192 = ABS(dVar6) <= ABS(dVar5) * 1e+308 && ABS(dVar4) <= ABS(dVar5) * 1e+308;
  }
  if (local_192) {
    s1 = dVar6 * (1.0 / dVar5);
    t0 = dVar4 * (1.0 / dVar5);
    if (s1 <= 1.0) {
      if (s1 < 0.0) {
        if (t0 < 0.0) goto LAB_0068fd56;
        s1 = 0.0;
      }
    }
    else {
      if (1.0 < t0) goto LAB_0068fd56;
      s1 = 1.0;
    }
    if (0.0 <= t0) {
      if (1.0 < t0) {
        t0 = 1.0;
      }
    }
    else {
      t0 = 0.0;
    }
    dVar3 = s1 * M;
    M = (1.0 - t0) * t1 + t0 * M;
    ON_Line::PointAt(&local_130,(ON_Line *)local_d0,s1);
    ON_3dVector::operator=((ON_3dVector *)local_98,&local_130);
    ON_Line::PointAt((ON_3dPoint *)auStack_148,(ON_Line *)local_d0,t0);
    chord.to.y = local_138;
    chord.from.z = _auStack_148;
    chord.to.x = dStack_140;
    ON_3dPoint::operator=((ON_3dPoint *)local_d0,(ON_3dVector *)local_98);
    t1 = (1.0 - s1) * t1 + dVar3;
  }
LAB_0068fd56:
  if ((chord.to.z._4_4_ == 0) || (local_104 == 0)) {
    local_198 = 2;
    if (chord.to.z._4_4_ != 1 && local_104 != 1) {
      local_198 = 1;
    }
  }
  else {
    local_198 = 0;
  }
  pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)local_d0,local_198);
  dVar3 = *pdVar2;
  pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&chord.from.z,local_198);
  dVar5 = *pdVar2;
  dVar6 = ON_3dPoint::operator[](&bbox->m_min,local_198);
  dVar4 = ON_3dPoint::operator[](&bbox->m_max,local_198);
  if (dVar4 < dVar6) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  dVar6 = dVar6 - ((double)line_parameters_local + dVar3);
  dVar4 = ((double)line_parameters_local - dVar3) + dVar4;
  if (dVar4 < dVar6) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  dVar5 = dVar5 - dVar3;
  if (((0.0 < dVar6) && (dVar5 < dVar6)) || ((dVar4 < 0.0 && (dVar4 < dVar5)))) {
    bbox_local._7_1_ = false;
    goto LAB_00690153;
  }
  if (line_parameters != (ON_Interval *)0x0) {
    local_1c2 = true;
    if (ABS(dVar5) < 1.0) {
      local_1c2 = ABS(dVar6) <= ABS(dVar5) * 1e+308 && ABS(dVar4) <= ABS(dVar5) * 1e+308;
    }
    if (local_1c2) {
      s1 = dVar6 * (1.0 / dVar5);
      t0 = dVar4 * (1.0 / dVar5);
      if (s1 <= 1.0) {
        if (s1 < 0.0) {
          if (t0 < 0.0) goto LAB_00690109;
          s1 = 0.0;
        }
      }
      else {
        if (1.0 < t0) goto LAB_00690109;
        s1 = 1.0;
      }
      if (0.0 <= t0) {
        if (1.0 < t0) {
          t0 = 1.0;
        }
      }
      else {
        t0 = 0.0;
      }
      dVar3 = s1 * M;
      M = (1.0 - t0) * t1 + t0 * M;
      t1 = (1.0 - s1) * t1 + dVar3;
    }
LAB_00690109:
    if (t1 <= M) {
      ON_Interval::Set(line_parameters,t1,M);
    }
    else {
      ON_Interval::Set(line_parameters,M,t1);
    }
  }
  bbox_local._7_1_ = true;
LAB_00690153:
  local_118 = 1;
  ON_Line::~ON_Line((ON_Line *)local_d0);
  return bbox_local._7_1_;
}

Assistant:

bool ON_Intersect( const ON_BoundingBox& bbox, 
                   const ON_Line& line, 
                   double tol,
                   ON_Interval* line_parameters)
{
  double a,b,d,mn,mx,s0,s1, t0, t1;
  const double M = 1.0e308;

  // i,j,k are indices of coordinates to trim.
  // trim the direction with the biggest line deltas first
  ON_3dVector v = line.Direction();
  const int i = v.MaximumCoordinateIndex();

  // guard against ON_UNSET_VALUE as input
  if ( !(tol >= 0.0) )
    tol = 0.0;

  // clip i-th coordinate
  a = line.from[i];
  b = line.to[i];
  mn = bbox.m_min[i];
  mx = bbox.m_max[i];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( 0.0 == d )
  {
    // happens when line.from == line.to
    if ( 0.0 < mn || 0.0 > mx )
    {
      // point is in box
      if ( line_parameters )
      {
        // setting parameters makes no sense - just use 0.0
        // so it's clear we have a point
        line_parameters->Set(0.0,0.0);
      }
      return true;
    }
    return false; // point is outside box
  }
  if ( fabs(d) < 1.0 && (fabs(mn) >= fabs(d)*M || fabs(mx) >= fabs(d)*M) )
  {
    // the value of mn/d or mx/d is too large for a realistic answer to be computed
    return false;
  }
  d = 1.0/d;
  t0 = mn*d;
  t1 = mx*d;

  // set "chord" = line segment that begins and ends on the
  // i-th coordinate box side planes.
  ON_Line chord(line.PointAt(t0),line.PointAt(t1));

  // test j-th coordinate direction
  const int j = (i + (fabs(v[(i+1)%3])>fabs(v[(i+2)%3])?1:2) ) % 3;
  a = chord.from[j];
  b = chord.to[j];
  mn = bbox.m_min[j];
  mx = bbox.m_max[j];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord lies outside the box
    return false;
  }

  while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
  {
    // The chord is not (nearly) parallel to the j-th sides.
    // See if the chord needs to be trimmed by the j-th sides.
    d = 1.0/d;
    s0 = mn*d;
    s1 = mx*d;
    if ( s0 > 1.0 )
    {
      if ( s1 > 1.0 )
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 1.0;
    }
    else if ( s0 < 0.0 )
    {
      if (s1 < 0.0)
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 0.0;
    }
    if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
    d = (1.0-s0)*t0 + s0*t1;
    t1 = (1.0-s1)*t0 + s1*t1;
    t0 = d;
    v = chord.PointAt(s0);
    chord.to = chord.PointAt(s1);
    chord.from = v;
    break;
  }
  
  // test k-th coordinate direction
  const int k = (i&&j) ? 0 : ((i!=1&&j!=1)?1:2);
  a = chord.from[k];
  b = chord.to[k];
  mn = bbox.m_min[k];
  mx = bbox.m_max[k];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord does not intersect the rectangle
    return false;
  }

  if ( line_parameters )
  {

    while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
    {
      // The chord is not (nearly) parallel to the k-th sides.
      // See if the chord needs to be trimmed by the k-th sides.
      d = 1.0/d;
      s0 = mn*d;
      s1 = mx*d;
      if ( s0 > 1.0 )
      {
        if ( s1 > 1.0 )
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 1.0;
      }
      else if ( s0 < 0.0 )
      {
        if (s1 < 0.0)
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 0.0;
      }

      if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
      d = (1.0-s0)*t0 + s0*t1;
      t1 = (1.0-s1)*t0 + s1*t1;
      t0 = d;
      break;
    }

    if (t0 > t1 )
    {
      line_parameters->Set(t1,t0);
    }
    else
    {
      line_parameters->Set(t0,t1);
    }
  }

  return true;
}